

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O2

Var Js::JavascriptMath::Decrement_Full(Var aRight,ScriptContext *scriptContext)

{
  bool bVar1;
  Var pvVar2;
  double value;
  
  bVar1 = TaggedInt::Is(aRight);
  if (bVar1) {
    pvVar2 = TaggedInt::Decrement(aRight,scriptContext);
    return pvVar2;
  }
  bVar1 = VarIs<Js::JavascriptBigInt>(aRight);
  if (bVar1) {
    pvVar2 = JavascriptBigInt::Decrement(aRight);
    return pvVar2;
  }
  value = Decrement_Helper(aRight,scriptContext);
  pvVar2 = JavascriptNumber::ToVarIntCheck(value,scriptContext);
  return pvVar2;
}

Assistant:

Var JavascriptMath::Decrement_Full(Var aRight, ScriptContext* scriptContext)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_Decrement_Full);
            if (TaggedInt::Is(aRight))
            {
                return TaggedInt::Decrement(aRight, scriptContext);
            }
            if (VarIs<JavascriptBigInt>(aRight))
            {
                return JavascriptBigInt::Decrement(aRight);
            }

            double dec = Decrement_Helper(aRight,scriptContext);
            return JavascriptNumber::ToVarIntCheck(dec, scriptContext);
            JIT_HELPER_END(Op_Decrement_Full);
        }